

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

void Jf_ManPropagateEla(Jf_Man_t *p,int fEdge)

{
  Gia_Obj_t *pObj;
  int *piVar1;
  uint uVar2;
  Jf_Par_t *pJVar3;
  Gia_Man_t *p_00;
  word *pwVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  int *piVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  pJVar3 = p->pPars;
  pJVar3->Area = 0;
  pJVar3->Edge = 0;
  pJVar3->Clause = 0;
  lVar12 = (long)p->pGia->nObjs;
  if (0 < lVar12) {
    do {
      p_00 = p->pGia;
      if (p_00->nObjs < lVar12) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p_00->pObjs == (Gia_Obj_t *)0x0) break;
      lVar13 = lVar12 + -1;
      pObj = p_00->pObjs + lVar13;
      uVar11 = (uint)*(undefined8 *)pObj;
      if (((-1 < (int)uVar11) && ((uVar11 & 0x1fffffff) != 0x1fffffff)) &&
         ((uVar11 & 0x1fffffff) == ((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff))) {
        Gia_ObjId(p_00,pObj);
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                      ,0x458,"void Jf_ObjPropagateBuf(Jf_Man_t *, Gia_Obj_t *, int)");
      }
      if (((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) && (0 < p_00->pRefs[lVar13])) {
        if ((uVar11 >> 0x1e & 1) != 0) {
          __assert_fail("Jf_ObjIsUnit(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                        ,0x57a,"void Jf_ManPropagateEla(Jf_Man_t *, int)");
        }
        if ((p->vCuts).nSize < lVar12) goto LAB_0075bc52;
        uVar11 = (p->vCuts).pArray[lVar13];
        pwVar4 = (p->pMem).pPages[(int)uVar11 >> ((byte)(p->pMem).nPageSize & 0x1f)];
        uVar2 = (p->pMem).uPageMask;
        p->vTemp->nSize = 0;
        iVar9 = Jf_CutCheckMffc_rec(p,(int *)((long)pwVar4 + (long)(int)(uVar11 & uVar2) * 8 + 4),
                                    0x32);
        pVVar5 = p->vTemp;
        if (0 < pVVar5->nSize) {
          piVar6 = pVVar5->pArray;
          piVar7 = p->pGia->pRefs;
          lVar14 = 0;
          do {
            piVar1 = piVar7 + piVar6[lVar14];
            *piVar1 = *piVar1 + 1;
            lVar14 = lVar14 + 1;
          } while (lVar14 < pVVar5->nSize);
        }
        if (iVar9 != 0) {
          if ((p->vCuts).nSize < lVar12) goto LAB_0075bc52;
          uVar11 = (p->vCuts).pArray[lVar13];
          iVar9 = Jf_CutDeref_rec(p,(int *)((long)(p->pMem).pPages
                                                  [(int)uVar11 >> ((byte)(p->pMem).nPageSize & 0x1f)
                                                  ] +
                                           (long)(int)(uVar11 & (p->pMem).uPageMask) * 8 + 4));
          Jf_ObjComputeBestCut(p,pObj,fEdge,1);
          if ((p->vCuts).nSize < lVar12) goto LAB_0075bc52;
          uVar11 = (p->vCuts).pArray[lVar13];
          iVar10 = Jf_CutRef_rec(p,(int *)((long)(p->pMem).pPages
                                                 [(int)uVar11 >> ((byte)(p->pMem).nPageSize & 0x1f)]
                                          + (long)(int)(uVar11 & (p->pMem).uPageMask) * 8 + 4));
          if (iVar9 < iVar10) {
            __assert_fail("CostBef >= CostAft",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                          ,0x581,"void Jf_ManPropagateEla(Jf_Man_t *, int)");
          }
        }
        pJVar3 = p->pPars;
        if (pJVar3->fGenCnf != 0) {
          if ((p->vCuts).nSize < lVar12) goto LAB_0075bc52;
          uVar11 = (p->vCuts).pArray[lVar13];
          uVar11 = *(uint *)((long)(p->pMem).pPages
                                   [(int)uVar11 >> ((byte)(p->pMem).nPageSize & 0x1f)] +
                            (long)(int)(uVar11 & (p->pMem).uPageMask) * 8 + 4) >> 9;
          if (p->vCnfs->nSize <= (int)uVar11) goto LAB_0075bc52;
          pJVar3->Clause = pJVar3->Clause + (long)p->vCnfs->pArray[uVar11];
        }
        if ((p->vCuts).nSize < lVar12) {
LAB_0075bc52:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar11 = (p->vCuts).pArray[lVar13];
        pJVar3->Edge = pJVar3->Edge +
                       (ulong)(*(uint *)((long)(p->pMem).pPages
                                               [(int)uVar11 >> ((byte)(p->pMem).nPageSize & 0x1f)] +
                                        (long)(int)(uVar11 & (p->pMem).uPageMask) * 8 + 4) & 0xf);
        pJVar3->Area = pJVar3->Area + 1;
      }
      bVar8 = 1 < lVar12;
      lVar12 = lVar13;
    } while (bVar8);
  }
  iVar9 = Jf_ManComputeDelay(p,1);
  p->pPars->Delay = (long)iVar9;
  return;
}

Assistant:

void Jf_ManPropagateEla( Jf_Man_t * p, int fEdge )
{
    Gia_Obj_t * pObj; 
    int i, CostBef, CostAft;
    p->pPars->Area = p->pPars->Edge = p->pPars->Clause = 0;
    Gia_ManForEachObjReverse( p->pGia, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
            Jf_ObjPropagateBuf( p, pObj, 1 );
        else if ( Gia_ObjIsAnd(pObj) && Gia_ObjRefNum(p->pGia, pObj) > 0 )
        {
            assert( Jf_ObjIsUnit(pObj) );
            if ( Jf_CutCheckMffc(p, Jf_ObjCutBest(p, i), 50) )
            {
                CostBef = Jf_CutDeref_rec( p, Jf_ObjCutBest(p, i) );
                Jf_ObjComputeBestCut( p, pObj, fEdge, 1 );
                CostAft = Jf_CutRef_rec( p, Jf_ObjCutBest(p, i) );
    //            if ( CostBef != CostAft )  printf( "%d -> %d   ", CostBef, CostAft );
                assert( CostBef >= CostAft ); // does not hold because of JF_EDGE_LIM
            }
            if ( p->pPars->fGenCnf )
            p->pPars->Clause += Jf_CutCnfSize(p, Jf_ObjCutBest(p, i));
            p->pPars->Edge += Jf_CutSize(Jf_ObjCutBest(p, i));
            p->pPars->Area++;
        }
    p->pPars->Delay = Jf_ManComputeDelay( p, 1 );
//    printf( "\n" );
}